

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool,false,true>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  long lVar7;
  uhugeint_t uVar8;
  uhugeint_t local_88;
  uhugeint_t local_78;
  ulong local_60;
  uint64_t local_58;
  uint64_t uStack_50;
  idx_t local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_58 = rdata->lower;
      uStack_50 = rdata->upper;
      lVar7 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
        local_78.lower = *puVar1;
        local_78.upper = puVar1[1];
        local_88.lower = local_58;
        local_88.upper = uStack_50;
        uVar8 = uhugeint_t::operator&(&local_78,&local_88);
        *(uint64_t *)((long)&result_data->lower + lVar7) = uVar8.lower;
        *(uint64_t *)((long)&result_data->upper + lVar7) = uVar8.upper;
        lVar7 = lVar7 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_38 = 0;
    uVar4 = 0;
    local_48 = count;
    do {
      puVar2 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar2[local_38];
      }
      uVar3 = uVar4 + 0x40;
      if (count <= uVar4 + 0x40) {
        uVar3 = count;
      }
      uVar5 = uVar3;
      if (uVar6 != 0) {
        uVar5 = uVar4;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar4 < uVar3) {
            local_58 = rdata->lower;
            uStack_50 = rdata->upper;
            lVar7 = uVar4 << 4;
            do {
              puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
              local_78.lower = *puVar1;
              local_78.upper = puVar1[1];
              local_88.lower = local_58;
              local_88.upper = uStack_50;
              uVar8 = uhugeint_t::operator&(&local_78,&local_88);
              *(uint64_t *)((long)&result_data->lower + lVar7) = uVar8.lower;
              *(uint64_t *)((long)&result_data->upper + lVar7) = uVar8.upper;
              uVar5 = uVar5 + 1;
              lVar7 = lVar7 + 0x10;
            } while (uVar3 != uVar5);
          }
        }
        else if (uVar4 < uVar3) {
          lVar7 = uVar4 << 4;
          uVar5 = 0;
          do {
            if ((uVar6 >> (uVar5 & 0x3f) & 1) != 0) {
              puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
              local_78.lower = *puVar1;
              local_78.upper = puVar1[1];
              local_88.lower = rdata->lower;
              local_88.upper = rdata->upper;
              uVar8 = uhugeint_t::operator&(&local_78,&local_88);
              *(uint64_t *)((long)&result_data->lower + lVar7) = uVar8.lower;
              *(uint64_t *)((long)&result_data->upper + lVar7) = uVar8.upper;
            }
            uVar5 = uVar5 + 1;
            lVar7 = lVar7 + 0x10;
          } while ((uVar4 - uVar3) + uVar5 != 0);
          count = local_48;
          uVar5 = uVar4 + uVar5;
        }
      }
      local_38 = local_38 + 1;
      uVar4 = uVar5;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}